

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int fits_hdecompress64(uchar *input,int smooth,LONGLONG *a,int *ny,int *nx,int *scale,int *status)

{
  long *plVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  LONGLONG LVar8;
  ulong uVar9;
  LONGLONG *pLVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  uint n;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  uint n_00;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  sbyte sVar34;
  ulong uVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  LONGLONG *pLVar40;
  ulong uVar41;
  long lVar42;
  bool bVar43;
  double dVar44;
  int local_150;
  int local_140;
  ulong local_138;
  ulong local_130;
  int local_124;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  int local_fc;
  int local_f8;
  ulong local_e8;
  
  iVar6 = *status;
  if (iVar6 < 1) {
    nextchar = 2;
    if (*(char (*) [2])input == code_magic) {
      iVar6 = readint(input);
      *nx = iVar6;
      iVar6 = readint(input);
      *ny = iVar6;
      iVar6 = readint(input);
      *scale = iVar6;
      LVar8 = readlonglong(input);
      bVar13 = input[nextchar];
      bVar14 = input[nextchar + 1];
      bVar3 = input[nextchar + 2];
      nextchar = nextchar + 3;
      iVar4 = *nx;
      iVar39 = *ny;
      uVar9 = 0;
      uVar18 = (ulong)(uint)(iVar39 * iVar4);
      if (iVar39 * iVar4 < 1) {
        uVar18 = uVar9;
      }
      for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
        a[uVar9] = 0;
      }
      iVar19 = (iVar4 + 1) / 2;
      iVar7 = (iVar39 + 1) / 2;
      bits_to_go = 0;
      iVar6 = qtree_decode64(input,a,iVar39,iVar19,iVar7,(uint)bVar13);
      if (iVar6 == 0) {
        iVar6 = qtree_decode64(input,a + iVar7,iVar39,iVar19,iVar39 / 2,(uint)bVar14);
        if (iVar6 == 0) {
          iVar6 = qtree_decode64(input,a + iVar19 * iVar39,iVar39,iVar4 / 2,iVar7,(uint)bVar14);
          if ((iVar6 == 0) &&
             (iVar6 = qtree_decode64(input,a + (iVar19 * iVar39 + iVar7),iVar39,iVar4 / 2,iVar39 / 2
                                     ,(uint)bVar3), iVar6 == 0)) {
            iVar6 = input_nybble(input);
            if (iVar6 == 0) {
              bits_to_go = 0;
              for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                if ((a[uVar9] != 0) && (iVar6 = input_bit(input), iVar6 != 0)) {
                  a[uVar9] = -a[uVar9];
                }
              }
              *a = LVar8;
              *status = 0;
              local_150 = *nx;
              iVar6 = *ny;
              iVar4 = *scale;
              if (1 < (long)iVar4) {
                for (pLVar10 = a; pLVar10 <= a + (long)(iVar6 * local_150) + -1;
                    pLVar10 = pLVar10 + 1) {
                  *pLVar10 = *pLVar10 * (long)iVar4;
                }
              }
              iVar39 = iVar6;
              if (iVar6 < local_150) {
                iVar39 = local_150;
              }
              dVar44 = log((double)iVar39);
              pLVar10 = (LONGLONG *)malloc((long)((iVar39 + 1) / 2) << 3);
              if (pLVar10 == (LONGLONG *)0x0) {
                ffpmsg("hinv64: insufficient memory");
                iVar6 = 0x19e;
              }
              else {
                local_fc = (int)(dVar44 / 0.6931471805599453 + 0.5);
                sVar34 = 1;
                bVar13 = (byte)local_fc;
                bVar43 = 1 << (bVar13 & 0x1f) < iVar39;
                local_fc = (bVar43 - 1) + local_fc;
                bVar14 = (byte)local_fc;
                local_e8 = 1L << (bVar14 & 0x3f);
                local_130 = 2L << (bVar14 & 0x3f);
                local_108 = (long)local_130 >> 1;
                local_140 = 1 << (bVar13 + bVar43 & 0x1f);
                *a = (*a >> 0x3f) + *a + ((4L << (bVar14 & 0x3f)) >> 1) & local_e8 * -4;
                uVar24 = (ulong)(iVar4 >> 1);
                iVar39 = iVar6 * 2;
                uVar25 = -uVar24;
                lVar26 = (long)iVar39;
                local_138 = 1;
                n_00 = 1;
                uVar18 = local_e8;
                uVar9 = -local_e8;
                local_124 = iVar6;
                local_118 = local_108 - 1;
                local_110 = local_e8 * -2;
                while (uVar16 = uVar9, uVar11 = uVar18, -1 < local_fc) {
                  local_e8 = (long)local_e8 >> 1;
                  local_140 = local_140 >> 1;
                  n_00 = n_00 * 2 - (uint)(local_150 <= local_140);
                  n = (int)local_138 * 2 - (uint)(local_124 <= local_140);
                  local_138 = (ulong)n;
                  uVar18 = 0;
                  pLVar40 = a;
                  if (0 < (int)n_00) {
                    uVar18 = (ulong)n_00;
                  }
                  while (bVar43 = uVar18 != 0, uVar18 = uVar18 - 1, bVar43) {
                    unshuffle64(pLVar40,n,1,pLVar10);
                    pLVar40 = pLVar40 + iVar6;
                  }
                  iVar7 = local_140;
                  if (local_124 <= local_140) {
                    iVar7 = 0;
                  }
                  uVar12 = local_e8 - 1;
                  uVar18 = 0;
                  pLVar40 = a;
                  if (0 < (int)n) {
                    uVar18 = local_138;
                  }
                  while (uVar18 != 0) {
                    unshuffle64(pLVar40,n_00,iVar6,pLVar10);
                    uVar18 = uVar18 - 1;
                    pLVar40 = pLVar40 + 1;
                  }
                  iVar19 = local_140;
                  if (local_150 <= local_140) {
                    iVar19 = 0;
                  }
                  bVar43 = local_fc == 0;
                  local_fc = local_fc + -1;
                  if (bVar43) {
                    sVar34 = 2;
                    uVar12 = 0;
                  }
                  if (0 < iVar4 >> 1 && smooth != 0) {
                    iVar36 = iVar6 * 3;
                    iVar15 = iVar39;
                    for (iVar22 = 2; iVar22 < (int)(n_00 - 2); iVar22 = iVar22 + 2) {
                      lVar30 = (long)iVar15;
                      for (lVar17 = 0; (int)lVar17 < (int)n; lVar17 = lVar17 + 2) {
                        uVar20 = a[lVar26 + lVar30 + lVar17] - a[lVar30 + lVar17];
                        uVar9 = a[lVar30 + lVar17] - a[lVar30 + (lVar17 - lVar26)];
                        uVar18 = uVar9;
                        if ((long)uVar20 < (long)uVar9) {
                          uVar18 = uVar20;
                        }
                        if ((long)uVar9 < (long)uVar20) {
                          uVar9 = uVar20;
                        }
                        if ((long)uVar18 < 1) {
                          uVar18 = 0;
                        }
                        lVar27 = uVar18 * 4;
                        lVar28 = ((long)uVar9 >> 0x3f & uVar9) * 4;
                        if (lVar28 < lVar27) {
                          lVar31 = a[lVar26 + lVar30 + lVar17] - a[lVar30 + (lVar17 - lVar26)];
                          if (lVar31 < lVar27) {
                            lVar27 = lVar31;
                          }
                          if (lVar31 <= lVar28) {
                            lVar27 = lVar28;
                          }
                          uVar9 = lVar27 + a[iVar36 + lVar17] * -8;
                          uVar18 = (long)(uVar9 + 7) >> 3;
                          if (-1 < (long)uVar9) {
                            uVar18 = uVar9 >> 3;
                          }
                          if ((long)uVar24 <= (long)uVar18) {
                            uVar18 = uVar24;
                          }
                          if ((long)uVar18 <= (long)uVar25) {
                            uVar18 = uVar25;
                          }
                          a[iVar36 + lVar17] = uVar18 + a[iVar36 + lVar17];
                        }
                      }
                      iVar15 = iVar15 + iVar39;
                      iVar36 = iVar36 + iVar39;
                    }
                    iVar36 = 2;
                    for (iVar22 = 0; iVar23 = 2, iVar15 = iVar6 * 3 + 2, local_f8 = iVar6 * 2 + 2,
                        iVar22 < (int)n_00; iVar22 = iVar22 + 2) {
                      for (lVar30 = 2; (int)lVar30 < (int)(n - 2); lVar30 = lVar30 + 2) {
                        uVar20 = a[iVar36 + lVar30] - a[(long)iVar36 + lVar30 + -2];
                        uVar9 = a[(long)iVar36 + lVar30 + -2] - a[(long)iVar36 + lVar30 + -4];
                        uVar18 = uVar9;
                        if ((long)uVar20 < (long)uVar9) {
                          uVar18 = uVar20;
                        }
                        if ((long)uVar9 < (long)uVar20) {
                          uVar9 = uVar20;
                        }
                        if ((long)uVar18 < 1) {
                          uVar18 = 0;
                        }
                        lVar17 = uVar18 * 4;
                        lVar27 = ((long)uVar9 >> 0x3f & uVar9) * 4;
                        if (lVar27 < lVar17) {
                          lVar28 = a[iVar36 + lVar30] - a[(long)iVar36 + lVar30 + -4];
                          if (lVar28 < lVar17) {
                            lVar17 = lVar28;
                          }
                          if (lVar28 <= lVar27) {
                            lVar17 = lVar27;
                          }
                          uVar9 = lVar17 + a[(long)iVar36 + lVar30 + -1] * -8;
                          uVar18 = (long)(uVar9 + 7) >> 3;
                          if (-1 < (long)uVar9) {
                            uVar18 = uVar9 >> 3;
                          }
                          if ((long)uVar24 <= (long)uVar18) {
                            uVar18 = uVar24;
                          }
                          if ((long)uVar18 <= (long)uVar25) {
                            uVar18 = uVar25;
                          }
                          a[(long)iVar36 + lVar30 + -1] = uVar18 + a[(long)iVar36 + lVar30 + -1];
                        }
                      }
                      iVar36 = iVar36 + iVar39;
                    }
                    for (; iVar23 < (int)(n_00 - 2); iVar23 = iVar23 + 2) {
                      lVar30 = (long)local_f8;
                      for (lVar17 = 0; (int)lVar17 + 2 < (int)(n - 2); lVar17 = lVar17 + 2) {
                        lVar42 = a[iVar15 + lVar17];
                        lVar31 = a[lVar30 + lVar17];
                        lVar29 = a[lVar26 + lVar30 + lVar17 + 2] - lVar31;
                        lVar33 = lVar31 - a[lVar26 + lVar30 + lVar17 + -2];
                        lVar28 = a[(lVar30 + lVar17 + -2) - lVar26] - lVar31;
                        lVar31 = lVar31 - a[(lVar30 + lVar17 + 2) - lVar26];
                        lVar27 = 0;
                        if (0 < lVar28) {
                          lVar27 = lVar28;
                        }
                        if (-1 < lVar28) {
                          lVar28 = 0;
                        }
                        lVar37 = 0;
                        if (0 < lVar31) {
                          lVar37 = lVar31;
                        }
                        if (-1 < lVar31) {
                          lVar31 = 0;
                        }
                        lVar38 = 0;
                        if (0 < lVar33) {
                          lVar38 = lVar33;
                        }
                        if (-1 < lVar33) {
                          lVar33 = 0;
                        }
                        lVar21 = 0;
                        if (0 < lVar29) {
                          lVar21 = lVar29;
                        }
                        lVar5 = a[lVar30 + lVar17 + 1];
                        if (-1 < lVar29) {
                          lVar29 = 0;
                        }
                        lVar2 = lVar42 * 2 + lVar5 * 2;
                        lVar21 = lVar21 - lVar2;
                        lVar38 = lVar38 + lVar42 * 2 + lVar5 * -2;
                        if (lVar21 < lVar38) {
                          lVar38 = lVar21;
                        }
                        lVar27 = lVar27 + lVar42 * 2;
                        lVar37 = lVar37 + lVar42 * -2;
                        if (lVar27 <= lVar37) {
                          lVar37 = lVar27;
                        }
                        lVar37 = lVar37 + lVar5 * 2;
                        if (lVar37 <= lVar38) {
                          lVar38 = lVar37;
                        }
                        lVar29 = lVar29 - lVar2;
                        lVar27 = lVar33 + lVar42 * 2 + lVar5 * -2;
                        lVar38 = lVar38 * 0x10;
                        if (lVar27 < lVar29) {
                          lVar27 = lVar29;
                        }
                        lVar31 = lVar31 + lVar42 * -2;
                        lVar28 = lVar28 + lVar42 * 2;
                        if (lVar31 <= lVar28) {
                          lVar31 = lVar28;
                        }
                        lVar31 = lVar31 + lVar5 * 2;
                        if (lVar27 <= lVar31) {
                          lVar27 = lVar31;
                        }
                        lVar27 = lVar27 * 0x10;
                        if (lVar27 < lVar38) {
                          lVar28 = (a[(lVar30 + lVar17 + -2) - lVar26] -
                                   (a[lVar26 + lVar30 + lVar17 + -2] +
                                   a[(lVar30 + lVar17 + 2) - lVar26])) +
                                   a[lVar26 + lVar30 + lVar17 + 2];
                          if (lVar28 < lVar38) {
                            lVar38 = lVar28;
                          }
                          if (lVar28 <= lVar27) {
                            lVar38 = lVar27;
                          }
                          uVar9 = lVar38 + a[(long)iVar15 + lVar17 + 1] * -0x40;
                          uVar18 = (long)(uVar9 + 0x3f) >> 6;
                          if (-1 < (long)uVar9) {
                            uVar18 = uVar9 >> 6;
                          }
                          if ((long)uVar24 <= (long)uVar18) {
                            uVar18 = uVar24;
                          }
                          if ((long)uVar18 <= (long)uVar25) {
                            uVar18 = uVar25;
                          }
                          a[(long)iVar15 + lVar17 + 1] = uVar18 + a[(long)iVar15 + lVar17 + 1];
                        }
                      }
                      iVar15 = iVar15 + iVar39;
                      local_f8 = local_f8 + iVar39;
                    }
                  }
                  local_124 = local_124 - iVar7;
                  local_150 = local_150 - iVar19;
                  iVar19 = (int)n % 2;
                  iVar22 = 0;
                  iVar7 = iVar6;
                  for (iVar36 = 0; lVar30 = (long)iVar22, iVar36 < (int)(n_00 - (int)n_00 % 2);
                      iVar36 = iVar36 + 2) {
                    lVar31 = lVar30 << 0x20;
                    lVar27 = (long)iVar7;
                    lVar28 = lVar27 << 0x20;
                    for (lVar17 = 0; (int)lVar17 < (int)(n - iVar19); lVar17 = lVar17 + 2) {
                      uVar18 = local_108;
                      if (a[lVar27 + lVar17] < 0) {
                        uVar18 = local_118;
                      }
                      uVar9 = uVar18 + a[lVar27 + lVar17] & local_110;
                      uVar18 = local_108;
                      if (a[lVar30 + lVar17 + 1] < 0) {
                        uVar18 = local_118;
                      }
                      uVar20 = uVar18 + a[lVar30 + lVar17 + 1] & local_110;
                      uVar18 = local_e8;
                      if (a[lVar27 + lVar17 + 1] < 0) {
                        uVar18 = uVar12;
                      }
                      uVar35 = uVar18 + a[lVar27 + lVar17 + 1] & uVar16;
                      uVar41 = uVar35 & uVar11;
                      uVar18 = -uVar41;
                      if ((long)uVar9 < 0) {
                        uVar18 = uVar41;
                      }
                      uVar18 = uVar18 + uVar9;
                      lVar42 = a[lVar30 + lVar17];
                      uVar9 = -uVar41;
                      if ((long)uVar20 < 0) {
                        uVar9 = uVar41;
                      }
                      uVar9 = uVar9 + uVar20;
                      uVar20 = (uVar18 ^ uVar35 ^ uVar9) & local_130;
                      if (lVar42 < 0) {
                        uVar32 = uVar41 - uVar20;
                        if (uVar41 == 0) {
                          uVar32 = uVar20;
                        }
                        lVar42 = uVar32 + lVar42;
                      }
                      else {
                        lVar42 = (uVar41 + lVar42) - uVar20;
                      }
                      a[lVar27 + lVar17 + 1] = (long)(lVar42 + uVar18 + uVar9 + uVar35) >> sVar34;
                      a[lVar27 + lVar17] = (long)((lVar42 + uVar18) - (uVar9 + uVar35)) >> sVar34;
                      a[lVar30 + lVar17 + 1] =
                           (long)((uVar9 - uVar35) + (lVar42 - uVar18)) >> sVar34;
                      a[lVar30 + lVar17] = (long)((uVar35 - uVar9) + (lVar42 - uVar18)) >> sVar34;
                      lVar31 = lVar31 + 0x200000000;
                      lVar28 = lVar28 + 0x200000000;
                    }
                    if (iVar19 != 0) {
                      lVar30 = *(long *)((long)a + (lVar28 >> 0x1d));
                      uVar18 = local_108;
                      if (lVar30 < 0) {
                        uVar18 = local_118;
                      }
                      lVar17 = *(long *)((long)a + (lVar31 >> 0x1d));
                      uVar9 = uVar18 + lVar30 & local_110;
                      uVar18 = -(uVar9 & local_130);
                      if (lVar17 < 0) {
                        uVar18 = uVar9 & local_130;
                      }
                      lVar17 = uVar18 + lVar17;
                      *(long *)((long)a + (lVar28 >> 0x1d)) = (long)(lVar17 + uVar9) >> sVar34;
                      *(long *)((long)a + (lVar31 >> 0x1d)) = (long)(lVar17 - uVar9) >> sVar34;
                    }
                    iVar7 = iVar7 + iVar39;
                    iVar22 = iVar22 + iVar39;
                  }
                  if ((int)n_00 % 2 != 0) {
                    lVar27 = lVar30 << 0x20;
                    for (lVar17 = 0; (int)lVar17 < (int)(n - iVar19); lVar17 = lVar17 + 2) {
                      uVar18 = local_108;
                      if (a[lVar30 + lVar17 + 1] < 0) {
                        uVar18 = local_118;
                      }
                      uVar9 = uVar18 + a[lVar30 + lVar17 + 1] & local_110;
                      uVar18 = -(uVar9 & local_130);
                      if (a[lVar30 + lVar17] < 0) {
                        uVar18 = uVar9 & local_130;
                      }
                      lVar28 = uVar18 + a[lVar30 + lVar17];
                      a[lVar30 + lVar17 + 1] = (long)(lVar28 + uVar9) >> sVar34;
                      a[lVar30 + lVar17] = (long)(lVar28 - uVar9) >> sVar34;
                      lVar27 = lVar27 + 0x200000000;
                    }
                    if (iVar19 != 0) {
                      plVar1 = (long *)((long)a + (lVar27 >> 0x1d));
                      *plVar1 = *plVar1 >> sVar34;
                    }
                  }
                  uVar18 = (long)uVar11 >> 1;
                  uVar9 = (long)uVar16 >> 1;
                  local_130 = uVar11;
                  local_118 = uVar12;
                  local_110 = uVar16;
                  local_108 = local_e8;
                }
                free(pLVar10);
                iVar6 = 0;
              }
              *status = iVar6;
              uVar9 = 0;
              uVar18 = (ulong)(uint)(*ny * *nx);
              if (*ny * *nx < 1) {
                uVar18 = uVar9;
              }
              for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                *(int *)((long)a + uVar9 * 4) = (int)a[uVar9];
              }
              return *status;
            }
            ffpmsg("dodecode64: bad bit plane values");
            iVar6 = 0x19e;
          }
        }
      }
      *a = LVar8;
      *status = iVar6;
    }
    else {
      ffpmsg("bad file format");
      *status = 0x19e;
      iVar6 = 0x19e;
    }
  }
  return iVar6;
}

Assistant:

int fits_hdecompress64(unsigned char *input, int smooth, LONGLONG *a, int *ny, int *nx, 
                     int *scale, int *status)
{
  /* 
     decompress the input byte stream using the H-compress algorithm
  
   input  - input array of compressed bytes
   a - pre-allocated array to hold the output uncompressed image
   nx - returned X axis size
   ny - returned Y axis size

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */
  int stat, *iarray, ii, nval;

  if (*status > 0) return(*status);

	/* decode the input array */

        FFLOCK;  /* decode uses the nextchar global variable */
	stat = decode64(input, a, nx, ny, scale);
        FFUNLOCK;

        *status = stat;
	if (stat) return(*status);
	
	/*
	 * Un-Digitize
	 */
	undigitize64(a, *nx, *ny, *scale);

	/*
	 * Inverse H-transform
	 */
	stat = hinv64(a, *nx, *ny, smooth, *scale);

        *status = stat;
	
         /* pack the I*8 values back into an I*4 array */
        iarray = (int *) a;
	nval = (*nx) * (*ny);

	for (ii = 0; ii < nval; ii++)
	   iarray[ii] = (int) a[ii];	

  return(*status);
}